

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Comparison.cpp
# Opt level: O1

bool CoreML::Specification::operator==(SupportVectorClassifier *a,SupportVectorClassifier *b)

{
  uint32_t uVar1;
  uint32_t uVar2;
  bool bVar3;
  undefined1 *puVar4;
  undefined1 *puVar5;
  
  puVar5 = (undefined1 *)a->kernel_;
  if ((Kernel *)puVar5 == (Kernel *)0x0) {
    puVar5 = _Kernel_default_instance_;
  }
  puVar4 = (undefined1 *)b->kernel_;
  if ((Kernel *)puVar4 == (Kernel *)0x0) {
    puVar4 = _Kernel_default_instance_;
  }
  bVar3 = operator==((Kernel *)puVar5,(Kernel *)puVar4);
  if (!bVar3) {
    return false;
  }
  bVar3 = operator==(&a->numberofsupportvectorsperclass_,&b->numberofsupportvectorsperclass_);
  if (!bVar3) {
    return false;
  }
  bVar3 = operator==(&a->coefficients_,&b->coefficients_);
  if (!bVar3) {
    return false;
  }
  bVar3 = operator==(&a->rho_,&b->rho_);
  if (!bVar3) {
    return false;
  }
  bVar3 = operator==(&a->proba_,&b->proba_);
  if (!bVar3) {
    return false;
  }
  bVar3 = operator==(&a->probb_,&b->probb_);
  if (!bVar3) {
    return false;
  }
  uVar1 = a->_oneof_case_[0];
  uVar2 = b->_oneof_case_[0];
  if (uVar1 != uVar2) {
    return false;
  }
  if (uVar1 == 4) {
    puVar4 = _DenseSupportVectors_default_instance_;
    puVar5 = _DenseSupportVectors_default_instance_;
    if (uVar1 == 4) {
      puVar5 = (undefined1 *)(a->supportVectors_).densesupportvectors_;
    }
    if (uVar2 == 4) {
      puVar4 = (undefined1 *)(b->supportVectors_).densesupportvectors_;
    }
    bVar3 = operator==(&((DenseSupportVectors *)puVar5)->vectors_,
                       &((DenseSupportVectors *)puVar4)->vectors_);
  }
  else {
    if (uVar1 != 3) goto LAB_00345f10;
    puVar4 = _SparseSupportVectors_default_instance_;
    puVar5 = _SparseSupportVectors_default_instance_;
    if (uVar1 == 3) {
      puVar5 = (undefined1 *)(a->supportVectors_).sparsesupportvectors_;
    }
    if (uVar2 == 3) {
      puVar4 = (undefined1 *)(b->supportVectors_).sparsesupportvectors_;
    }
    bVar3 = operator==(&((SparseSupportVectors *)puVar5)->vectors_,
                       &((SparseSupportVectors *)puVar4)->vectors_);
  }
  if (bVar3 == false) {
    return false;
  }
LAB_00345f10:
  uVar1 = a->_oneof_case_[1];
  uVar2 = b->_oneof_case_[1];
  if (uVar1 != uVar2) {
    return false;
  }
  if (uVar1 != 0) {
    if (uVar1 == 100) {
      puVar4 = _StringVector_default_instance_;
      puVar5 = _StringVector_default_instance_;
      if (uVar1 == 100) {
        puVar5 = (undefined1 *)(a->ClassLabels_).stringclasslabels_;
      }
      if (uVar2 == 100) {
        puVar4 = (undefined1 *)(b->ClassLabels_).stringclasslabels_;
      }
      bVar3 = vectorsEqual<CoreML::Specification::StringVector>
                        ((StringVector *)puVar5,(StringVector *)puVar4);
      return bVar3;
    }
    puVar4 = _Int64Vector_default_instance_;
    puVar5 = _Int64Vector_default_instance_;
    if (uVar1 == 0x65) {
      puVar5 = (undefined1 *)(a->ClassLabels_).int64classlabels_;
    }
    if (uVar2 == 0x65) {
      puVar4 = (undefined1 *)(b->ClassLabels_).int64classlabels_;
    }
    bVar3 = vectorsEqual<CoreML::Specification::Int64Vector>
                      ((Int64Vector *)puVar5,(Int64Vector *)puVar4);
    return bVar3;
  }
  return true;
}

Assistant:

bool operator==(const SupportVectorClassifier& a,
                        const SupportVectorClassifier& b) {
            if (a.kernel() != b.kernel()) {
                return false;
            }
            if (a.numberofsupportvectorsperclass() != b.numberofsupportvectorsperclass()) {
                return false;
            }
            if (a.coefficients() != b.coefficients()) {
                return false;
            }
            if (a.rho() != b.rho()) {
                return false;
            }
            if (a.proba() != b.proba()) {
                return false;
            }
            if (a.probb() != b.probb()) {
                return false;
            }
            if (a.supportVectors_case() != b.supportVectors_case()) {
                return false;
            }
            switch (a.supportVectors_case()) {
                case SupportVectorClassifier::kSparseSupportVectors:
                    if (a.sparsesupportvectors().vectors() != b.sparsesupportvectors().vectors()) {
                        return false;
                    }
                    break;
                case SupportVectorClassifier::kDenseSupportVectors:
                    if (a.densesupportvectors().vectors() != b.densesupportvectors().vectors()) {
                        return false;
                    }
                    break;
                case SupportVectorClassifier::SUPPORTVECTORS_NOT_SET:
                    break;
            }
            if (a.ClassLabels_case() != b.ClassLabels_case()) {
                return false;
            }
            switch (a.ClassLabels_case()) {
                case SupportVectorClassifier::kInt64ClassLabels:
                    return a.int64classlabels() == b.int64classlabels();
                case SupportVectorClassifier::kStringClassLabels:
                    return a.stringclasslabels() == b.stringclasslabels();
                case SupportVectorClassifier::CLASSLABELS_NOT_SET:
                    return true;
            }
        }